

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::GetRepeatedMessage
          (ExtensionSet *this,int number,int index)

{
  byte bVar1;
  _Base_ptr p_Var2;
  LogMessage *pLVar3;
  Type *pTVar4;
  _Rb_tree_header *p_Var5;
  _Base_ptr p_Var6;
  LogFinisher local_59;
  LogMessage local_58;
  
  p_Var2 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = &p_Var5->_M_header;
  if (p_Var2 != (_Base_ptr)0x0) {
    do {
      if (number <= (int)p_Var2[1]._M_color) {
        p_Var6 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < number];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var6 != p_Var5) && ((int)p_Var6[1]._M_color <= number))
    goto LAB_00346499;
  }
  LogMessage::LogMessage
            (&local_58,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
             ,0x2d5);
  pLVar3 = LogMessage::operator<<(&local_58,"CHECK failed: iter != extensions_.end(): ");
  pLVar3 = LogMessage::operator<<(pLVar3,"Index out-of-bounds (field is empty).");
  LogFinisher::operator=(&local_59,pLVar3);
  LogMessage::~LogMessage(&local_58);
  p_Var6 = &p_Var5->_M_header;
LAB_00346499:
  if (*(char *)((long)&p_Var6[1]._M_left + 1) == '\0') {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x2d6);
    pLVar3 = LogMessage::operator<<
                       (&local_58,
                        "CHECK failed: ((iter->second).is_repeated ? REPEATED : OPTIONAL) == (REPEATED): "
                       );
    LogFinisher::operator=(&local_59,pLVar3);
    LogMessage::~LogMessage(&local_58);
  }
  bVar1 = *(byte *)&p_Var6[1]._M_left;
  if ((byte)(bVar1 - 0x13) < 0xee) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x34);
    pLVar3 = LogMessage::operator<<
                       (&local_58,
                        "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
    LogFinisher::operator=(&local_59,pLVar3);
    LogMessage::~LogMessage(&local_58);
  }
  if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 10) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x2d6);
    pLVar3 = LogMessage::operator<<
                       (&local_58,
                        "CHECK failed: (cpp_type((iter->second).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                       );
    LogFinisher::operator=(&local_59,pLVar3);
    LogMessage::~LogMessage(&local_58);
  }
  pTVar4 = RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                     ((RepeatedPtrFieldBase *)p_Var6[1]._M_parent,index);
  return pTVar4;
}

Assistant:

const MessageLite& ExtensionSet::GetRepeatedMessage(
    int number, int index) const {
  ExtensionMap::const_iterator iter = extensions_.find(number);
  GOOGLE_CHECK(iter != extensions_.end()) << "Index out-of-bounds (field is empty).";
  GOOGLE_DCHECK_TYPE(iter->second, REPEATED, MESSAGE);
  return iter->second.repeated_message_value->Get(index);
}